

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuckinghamInteractionType.hpp
# Opt level: O1

void __thiscall
OpenMD::BuckinghamInteractionType::BuckinghamInteractionType
          (BuckinghamInteractionType *this,RealType myA,RealType myB,RealType myC,RealType mySigma,
          RealType myEpsilon,BuckinghamType myType)

{
  NonBondedInteractionType::NonBondedInteractionType(&this->super_NonBondedInteractionType);
  (this->super_NonBondedInteractionType)._vptr_NonBondedInteractionType =
       (_func_int **)&PTR__NonBondedInteractionType_002ffe78;
  this->A = myA;
  this->B = myB;
  this->C = myC;
  this->sigma = mySigma;
  this->epsilon = myEpsilon;
  this->interactionType = myType;
  NonBondedInteractionType::setBuckingham(&this->super_NonBondedInteractionType);
  return;
}

Assistant:

BuckinghamInteractionType(RealType myA, RealType myB, RealType myC,
                              RealType mySigma, RealType myEpsilon,
                              BuckinghamType myType) {
      A               = myA;
      B               = myB;
      C               = myC;
      sigma           = mySigma;
      epsilon         = myEpsilon;
      interactionType = myType;
      setBuckingham();
    }